

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

bool from_issue_342::test_uintwide_t_spot_values_from_issue_342_pos(void)

{
  enable_if_t<((_false)_&&_(_false)),_int> *in_R8;
  local_uint128_t b;
  local_uint128_t a;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>_>
  r_pp;
  
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&a,0xb,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            (&b,3,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::divmod<128u,unsigned_int,void,false,false>
            (&r_pp,(wide_integer *)&a,&b,(uintwide_t<128U,_unsigned_int,_void,_false> *)0x0,in_R8);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&a,0xc,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
            (&b,3,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::divmod<128u,unsigned_int,void,false,false>
            (&r_pp,(wide_integer *)&a,&b,(uintwide_t<128U,_unsigned_int,_void,_false> *)0x0,in_R8);
  return true;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_342_pos() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/342

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    auto result_is_ok = true;

    {
      const local_uint128_t a = 11;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_pp_is_ok = ((r_pp.first == +3) && (r_pp.second == +2));

      result_is_ok = (result_pp_is_ok && result_is_ok);
    }

    {
      const local_uint128_t a = 12;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_divmod_is_ok = ((r_pp.first == +4) && (r_pp.second == 0));

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    return result_is_ok;
  }